

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::
         format<std::__cxx11::string,int,std::__cxx11::string,std::__cxx11::string,unsigned_int,unsigned_int,unsigned_int,unsigned_long>
                   (char *fmt,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   int *args_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   uint *args_4,uint *args_5,uint *args_6,unsigned_long *args_7)

{
  long lVar1;
  string *in_RDI;
  long in_FS_OFFSET;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  string *args_1_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  char *in_stack_fffffffffffffe30;
  ostream *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [5];
  uint *in_stack_ffffffffffffff20;
  uint *in_stack_ffffffffffffff28;
  uint *in_stack_ffffffffffffff30;
  unsigned_long *in_stack_ffffffffffffff38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args_00 = local_190;
  args_1_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)args_00);
  format<std::__cxx11::string,int,std::__cxx11::string,std::__cxx11::string,unsigned_int,unsigned_int,unsigned_int,unsigned_long>
            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,args_00,(int *)args_1_00,in_RDI,
             in_stack_fffffffffffffe10,in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return args_1_00;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}